

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O0

void __thiscall QtMWidgets::ScrollIndicator::paintEvent(ScrollIndicator *this,QPaintEvent *param_1)

{
  QPainter local_20 [8];
  QPainter p;
  QPaintEvent *param_1_local;
  ScrollIndicator *this_local;
  
  _p = param_1;
  QPainter::QPainter(local_20,(QPaintDevice *)&this->field_0x10);
  if (this->policy == ScrollIndicatorAsNeeded) {
    if ((this->needPaint & 1U) == 0) goto LAB_001b6e0e;
  }
  else if (this->policy != ScrollIndicatorAlwaysOn) goto LAB_001b6e0e;
  drawIndicator(this,local_20,&this->color);
LAB_001b6e0e:
  QPainter::~QPainter(local_20);
  return;
}

Assistant:

void
ScrollIndicator::paintEvent( QPaintEvent * )
{
	QPainter p( this );

	switch( policy )
	{
		case AbstractScrollArea::ScrollIndicatorAsNeeded :
			if( !needPaint )
				break;
			[[fallthrough]];
		case AbstractScrollArea::ScrollIndicatorAlwaysOn :
			drawIndicator( &p, color );
		break;

		default:
			break;
	}
}